

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_maps_iterator.cc
# Opt level: O0

void tcmalloc::SaveProcSelfMapsToRawFD(RawFD fd)

{
  undefined1 local_2040 [8];
  RawFDGenericWriter<8192> writer;
  RawFD fd_local;
  
  writer._8236_4_ = fd;
  RawFDGenericWriter<8192>::RawFDGenericWriter((RawFDGenericWriter<8192> *)local_2040,fd);
  SaveProcSelfMaps((GenericWriter *)local_2040);
  RawFDGenericWriter<8192>::~RawFDGenericWriter((RawFDGenericWriter<8192> *)local_2040);
  return;
}

Assistant:

void SaveProcSelfMapsToRawFD(RawFD fd) {
  RawFDGenericWriter<> writer(fd);
  SaveProcSelfMaps(&writer);
}